

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int derive_exporter_secret(ptls_t *tls,int is_early)

{
  uint8_t *puVar1;
  char *pcVar2;
  ptls_iovec_t secret;
  anon_struct_16_2_29cc69bf_for_exporter_master_secret *local_40;
  uint8_t **slot;
  int ret;
  int is_early_local;
  ptls_t *tls_local;
  
  if (((byte)tls->ctx->field_0xb8 >> 1 & 1) == 0) {
    tls_local._4_4_ = 0;
  }
  else {
    if (is_early == 0) {
      local_40 = (anon_struct_16_2_29cc69bf_for_exporter_master_secret *)
                 &(tls->exporter_master_secret).one_rtt;
    }
    else {
      local_40 = &tls->exporter_master_secret;
    }
    if (local_40->early != (uint8_t *)0x0) {
      __assert_fail("*slot == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x5bc,"int derive_exporter_secret(ptls_t *, int)");
    }
    puVar1 = (uint8_t *)malloc((tls->key_schedule->hashes[0].algo)->digest_size);
    local_40->early = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      tls_local._4_4_ = 0x201;
    }
    else {
      pcVar2 = "exp master";
      if (is_early != 0) {
        pcVar2 = "e exp master";
      }
      tls_local._4_4_ = derive_secret(tls->key_schedule,local_40->early,pcVar2);
      if (tls_local._4_4_ == 0) {
        pcVar2 = "EXPORTER_SECRET";
        if (is_early != 0) {
          pcVar2 = "EARLY_EXPORTER_SECRET";
        }
        secret = ptls_iovec_init(local_40->early,(tls->key_schedule->hashes[0].algo)->digest_size);
        log_secret(tls,pcVar2,secret);
        tls_local._4_4_ = 0;
      }
    }
  }
  return tls_local._4_4_;
}

Assistant:

static int derive_exporter_secret(ptls_t *tls, int is_early)
{
    int ret;

    if (!tls->ctx->use_exporter)
        return 0;

    uint8_t **slot = is_early ? &tls->exporter_master_secret.early : &tls->exporter_master_secret.one_rtt;
    assert(*slot == NULL);
    if ((*slot = malloc(tls->key_schedule->hashes[0].algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if ((ret = derive_secret(tls->key_schedule, *slot, is_early ? "e exp master" : "exp master")) != 0)
        return ret;

    log_secret(tls, is_early ? "EARLY_EXPORTER_SECRET" : "EXPORTER_SECRET",
               ptls_iovec_init(*slot, tls->key_schedule->hashes[0].algo->digest_size));

    return 0;
}